

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O1

int math_fmod(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  lua_Integer lVar3;
  long n;
  lua_Number __x;
  lua_Number __y;
  double n_00;
  
  iVar1 = lua_isinteger(L,1);
  if ((iVar1 != 0) && (iVar1 = lua_isinteger(L,2), iVar1 != 0)) {
    lVar2 = lua_tointegerx(L,2,(int *)0x0);
    if (lVar2 + 1U < 2) {
      if (lVar2 == 0) {
        luaL_argerror(L,2,"zero");
      }
      n = 0;
    }
    else {
      lVar3 = lua_tointegerx(L,1,(int *)0x0);
      n = lVar3 % lVar2;
    }
    lua_pushinteger(L,n);
    return 1;
  }
  __x = luaL_checknumber(L,1);
  __y = luaL_checknumber(L,2);
  n_00 = fmod(__x,__y);
  lua_pushnumber(L,n_00);
  return 1;
}

Assistant:

static int math_fmod(lua_State *L) {
    if (lua_isinteger(L, 1) && lua_isinteger(L, 2)) {
        lua_Integer d = lua_tointeger(L, 2);
        if ((lua_Unsigned) d + 1u <= 1u) {  /* special cases: -1 or 0 */
            luaL_argcheck(L, d != 0, 2, "zero");
            lua_pushinteger(L, 0);  /* avoid overflow with 0x80000... / -1 */
        } else
            lua_pushinteger(L, lua_tointeger(L, 1) % d);
    } else
        lua_pushnumber(L, l_mathop(fmod)(luaL_checknumber(L, 1),
                                         luaL_checknumber(L, 2)));
    return 1;
}